

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
jsoncons::jsonpatch::detail::jsonpatch_names<char>::remove_name_abi_cxx11_(void)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  if (remove_name[abi:cxx11]()::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&remove_name[abi:cxx11]()::name_abi_cxx11_);
    if (iVar1 != 0) {
      remove_name[abi:cxx11]()::name_abi_cxx11_._M_dataplus._M_p =
           (pointer)&remove_name[abi:cxx11]()::name_abi_cxx11_.field_2;
      remove_name[abi:cxx11]()::name_abi_cxx11_.field_2._M_allocated_capacity._0_4_ = 0x6f6d6572;
      remove_name[abi:cxx11]()::name_abi_cxx11_.field_2._M_allocated_capacity._4_2_ = 0x6576;
      remove_name[abi:cxx11]()::name_abi_cxx11_._M_string_length = 6;
      remove_name[abi:cxx11]()::name_abi_cxx11_.field_2._M_local_buf[6] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&remove_name[abi:cxx11]()::name_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&remove_name[abi:cxx11]()::name_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            ((string *)in_RDI,(string *)&remove_name[abi:cxx11]()::name_abi_cxx11_);
  return in_RDI;
}

Assistant:

static std::basic_string<CharT> remove_name()
        {
            static std::basic_string<CharT> name{'r','e','m','o','v','e'};
            return name;
        }